

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void auto_arima_predict(auto_arima_object obj,double *inp,double *xreg,int L,double *newxreg,
                       double *xpred,double *amse)

{
  int d_00;
  int N_00;
  int iVar1;
  int iVar2;
  int D_00;
  int iVar3;
  int iVar4;
  int s_00;
  int iVar5;
  double *C;
  double *C_00;
  double *oup;
  double *W_00;
  double *resid_00;
  double *phi_00;
  double *theta_00;
  double local_d8;
  double wmean;
  double *theta;
  double *phi;
  double *resid;
  double *W;
  double *delta;
  double *coef2;
  double *coef1;
  uint local_90;
  int diter;
  int j;
  int qs;
  int ps;
  int t;
  int q;
  int p;
  int s;
  int Q;
  int P;
  int D;
  int ir;
  int iq;
  int ip;
  int N;
  int i;
  int d;
  double *xpred_local;
  double *newxreg_local;
  int L_local;
  double *xreg_local;
  double *inp_local;
  auto_arima_object obj_local;
  
  d_00 = obj->d;
  N_00 = obj->N;
  iVar1 = obj->p;
  iVar2 = obj->q;
  D_00 = obj->D;
  iVar3 = obj->P;
  iVar4 = obj->Q;
  s_00 = obj->s;
  P = iVar1 + s_00 * iVar3;
  iVar5 = iVar2 + 1 + s_00 * iVar4;
  if (P < iVar5) {
    P = iVar5;
  }
  C = (double *)malloc((long)(d_00 + 1) << 3);
  C_00 = (double *)malloc((long)(D_00 * s_00 + 1) << 3);
  oup = (double *)malloc((long)(d_00 + D_00 * s_00 + 1) << 3);
  W_00 = (double *)malloc((long)N_00 << 3);
  resid_00 = (double *)malloc((long)N_00 << 3);
  coef1._4_4_ = (uint)(obj->idrift == 1);
  phi_00 = (double *)malloc((long)P << 3);
  theta_00 = (double *)malloc((long)P << 3);
  local_d8 = 0.0;
  *C_00 = 1.0;
  *C = 1.0;
  if ((d_00 == 0) && (D_00 == 0)) {
    *oup = 1.0;
    local_d8 = obj->mean;
  }
  if (0 < d_00) {
    deld(d_00,C);
  }
  if (0 < D_00) {
    delds(D_00,s_00,C_00);
  }
  conv(C,d_00 + 1,C_00,D_00 * s_00 + 1,oup);
  for (ip = 1; ip <= d_00 + D_00 * s_00; ip = ip + 1) {
    oup[ip] = oup[ip] * -1.0;
  }
  for (ip = 0; ip < N_00; ip = ip + 1) {
    W_00[ip] = inp[ip];
    if ((d_00 == 0) && (D_00 == 0)) {
      W_00[ip] = W_00[ip] - local_d8;
    }
    if (obj->idrift == 1) {
      W_00[ip] = -*obj->exog * (double)(ip + 1) + W_00[ip];
    }
    if (0 < obj->r) {
      for (local_90 = coef1._4_4_; (int)local_90 < obj->r; local_90 = local_90 + 1) {
        W_00[ip] = -obj->exog[(int)local_90] * xreg[(int)((local_90 - coef1._4_4_) * N_00 + ip)] +
                   W_00[ip];
      }
    }
    resid_00[ip] = obj->res[ip];
  }
  for (ip = 0; ip < P; ip = ip + 1) {
    theta_00[ip] = 0.0;
    phi_00[ip] = 0.0;
  }
  for (ip = 0; ip < iVar1; ip = ip + 1) {
    phi_00[ip] = obj->phi[ip];
  }
  for (ip = 0; ip < iVar2; ip = ip + 1) {
    theta_00[ip] = obj->theta[ip] * -1.0;
  }
  for (local_90 = 0; (int)local_90 < iVar3; local_90 = local_90 + 1) {
    iVar5 = (local_90 + 1) * s_00 + -1;
    phi_00[iVar5] = obj->PHI[(int)local_90] + phi_00[iVar5];
    for (ip = 0; ip < iVar1; ip = ip + 1) {
      iVar5 = (local_90 + 1) * s_00 + ip;
      phi_00[iVar5] = -obj->phi[ip] * obj->PHI[(int)local_90] + phi_00[iVar5];
    }
  }
  for (local_90 = 0; (int)local_90 < iVar4; local_90 = local_90 + 1) {
    iVar5 = (local_90 + 1) * s_00 + -1;
    theta_00[iVar5] = theta_00[iVar5] - obj->THETA[(int)local_90];
    for (ip = 0; ip < iVar2; ip = ip + 1) {
      iVar5 = (local_90 + 1) * s_00 + ip;
      theta_00[iVar5] = obj->theta[ip] * obj->THETA[(int)local_90] + theta_00[iVar5];
    }
  }
  forkal(iVar1 + s_00 * iVar3,iVar2 + s_00 * iVar4,d_00 + D_00 * s_00,phi_00,theta_00,oup + 1,N_00,
         W_00,resid_00,L,xpred,amse);
  for (ip = 0; ip < L; ip = ip + 1) {
    xpred[ip] = local_d8 + xpred[ip];
    if (obj->idrift == 1) {
      xpred[ip] = *obj->exog * (double)(ip + 1 + N_00) + xpred[ip];
    }
    for (local_90 = coef1._4_4_; (int)local_90 < obj->r; local_90 = local_90 + 1) {
      xpred[ip] = obj->exog[(int)local_90] * newxreg[(int)((local_90 - coef1._4_4_) * L + ip)] +
                  xpred[ip];
    }
  }
  free(C);
  free(C_00);
  free(oup);
  free(W_00);
  free(resid_00);
  free(phi_00);
  free(theta_00);
  return;
}

Assistant:

void auto_arima_predict(auto_arima_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j,diter;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	p = obj->p;
	q = obj->q;
	D = obj->D;
	P = obj->P;
	Q = obj->Q;
	s = obj->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	diter = 0;

	if (obj->idrift == 1) {
		diter = 1;		
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		if (obj->idrift == 1) {
			W[i] -= obj->exog[0]*(i+1);
		}
		if (obj->r > 0) {
			for(j = diter; j < obj->r;++j) {
				W[i] -= obj->exog[j] * xreg[(j-diter)*N+i];
			}
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->phi[i] * obj->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->theta[i] * obj->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
		if (obj->idrift == 1) {
			xpred[i] += obj->exog[0]*(i+1+N);
		}
		for(j = diter; j < obj->r;++j) {
			xpred[i] += obj->exog[j] * newxreg[(j - diter)*L+i];
		}
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}